

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

void __thiscall cppforth::Forth::readLine(Forth *this)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  _Ios_Iostate _Var5;
  ulong uVar6;
  element_type *peVar7;
  reference pvVar8;
  size_t sVar9;
  streamsize infoLength;
  Cell realLength;
  vector<char,_std::allocator<char>_> readBuffer;
  Cell u2;
  Cell flag;
  Cell ior;
  uint caddr;
  size_t length;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  uint h;
  Forth *this_local;
  
  requireDStackDepth(this,3,"READ-LINE");
  uVar3 = ForthStack<unsigned_int>::getTop(&this->dStack);
  f.
  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = uVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"READ-LINE",&local_49);
  GetFileHandle((Forth *)local_28,(Cell)this,(string *)(ulong)uVar3,(errorCodes)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  uVar3 = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  uVar6 = (ulong)uVar3;
  uVar3 = ForthStack<unsigned_int>::getTop(&this->dStack,2);
  u2 = 0;
  readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = this->True;
  readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0;
  if (uVar6 != 0) {
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&realLength,uVar6 + 2,
               (allocator_type *)((long)&infoLength + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&infoLength + 7));
    std::
    __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_28);
    iVar4 = std::ios::rdstate();
    if (iVar4 == 4) {
      peVar7 = std::
               __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
      std::ios::clear((int)peVar7 + (int)*(undefined8 *)(*(long *)peVar7 + -0x18));
    }
    peVar7 = std::
             __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    std::ios::clear((int)peVar7 + (int)*(undefined8 *)(*(long *)peVar7 + -0x18));
    peVar7 = std::
             __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&realLength,0);
    std::istream::getline((char *)peVar7,(long)pvVar8);
    pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&realLength,0);
    sVar9 = strlen(pvVar8);
    infoLength._0_4_ = (uint)sVar9;
    if ((sVar9 & 0xffffffff) == uVar6) {
      std::
      __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_28);
      iVar4 = std::ios::rdstate();
      if (iVar4 == 4) {
        peVar7 = std::
                 __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_28);
        std::ios::clear((int)peVar7 + (int)*(undefined8 *)(*(long *)peVar7 + -0x18));
      }
    }
    uVar1 = (uint)infoLength;
    uVar6 = (ulong)(uint)infoLength;
    std::
    __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_28);
    std::istream::gcount();
    pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&realLength,0);
    moveIntoDataSpace(this,uVar3,pvVar8,uVar6);
    readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = uVar1;
    std::
    __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_28);
    _Var5 = std::ios::rdstate();
    _Var5 = std::operator&(_Var5,_S_eofbit);
    if ((_Var5 == _S_goodbit) ||
       (readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ != 0)) {
      readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = this->True;
    }
    else {
      readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = this->False;
    }
    std::
    __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_28);
    bVar2 = std::ios::bad();
    u2 = 0;
    if ((bVar2 & 1) != 0) {
      u2 = 0xffffffb9;
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)&realLength);
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,0,u2);
  ForthStack<unsigned_int>::setTop
            (&this->dStack,1,
             readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_);
  ForthStack<unsigned_int>::setTop
            (&this->dStack,2,
             readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_);
  std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>::~shared_ptr
            ((shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)local_28);
  return;
}

Assistant:

void readLine() {
	REQUIRE_DSTACK_DEPTH(3, "READ-LINE");
	auto h = (dStack.getTop()); 
	auto f = GetFileHandle(h, "READ-LINE", errorReadLine);
	auto length = SIZE_T(dStack.getTop(1));
	auto caddr = (dStack.getTop(2));
	Cell ior = 0;
	Cell flag = True;
	Cell u2 = 0;
	if (length > 0) {
		std::vector<char> readBuffer(length+2);
		if(f->rdstate() == std::ios::failbit) {
			f->clear(); // EOL is not read. Need to clear failbit flag and continue reading
		}
		f->clear();
		f->getline(&readBuffer[0], static_cast<std::streamsize>(length+1)); // add termination 0 to char counter
		auto realLength = static_cast<Cell>(std::strlen(&readBuffer[0]));
		if (realLength == (length ) && f->rdstate() == std::ios::failbit) {
			f->clear(); // EOL is not read. Need to clear failbit flag and continue reading
		}
		length = realLength;
		auto infoLength = f->gcount();
		moveIntoDataSpace(caddr, &readBuffer[0], length);
		u2 = static_cast<Cell>(length);
		if (f->rdstate() & std::ios::eofbit && u2==0) {
			flag = False; // EOF
		}
		else {
			flag = True;
		}
		ior = f->bad() ? Cell(errorReadLine) : 0;
	}
	
	dStack.setTop(0, ior);
	dStack.setTop(1, flag);
	dStack.setTop(2, u2);
}